

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O1

void __thiscall
icu_63::DecimalFormat::doFastFormatInt32
          (DecimalFormat *this,int32_t input,bool isNegative,UnicodeString *output)

{
  char cVar1;
  UChar UVar2;
  DecimalFormatFields *pDVar3;
  char cVar4;
  div_t dVar5;
  undefined7 in_register_00000011;
  char cVar6;
  char cVar7;
  UChar *srcChars;
  bool bVar8;
  char16_t localBuffer [13];
  char16_t local_58 [13];
  UChar local_3e [7];
  
  dVar5.rem = 0;
  dVar5.quot = input;
  if ((int)CONCAT71(in_register_00000011,isNegative) != 0) {
    local_58[0] = (this->fields->fastData).cpMinusSign;
    icu_63::UnicodeString::doAppend(output,local_58,0,1);
    dVar5.quot = -input;
    dVar5.rem = 0;
  }
  srcChars = local_3e;
  pDVar3 = this->fields;
  cVar1 = (pDVar3->fastData).maxInt;
  if ('\0' < cVar1) {
    cVar4 = '\0';
    cVar7 = '\0';
    do {
      if ((dVar5.quot == 0) && ((pDVar3->fastData).minInt <= cVar7)) break;
      cVar6 = cVar4 + '\x01';
      bVar8 = cVar4 == '\x03';
      cVar4 = cVar6;
      if ((bVar8) && (UVar2 = (pDVar3->fastData).cpGroupingSeparator, UVar2 != L'\0')) {
        srcChars[-1] = UVar2;
        srcChars = srcChars + -1;
        cVar4 = '\x01';
      }
      dVar5 = div(dVar5.quot,10);
      srcChars[-1] = (short)dVar5.rem + (pDVar3->fastData).cpZero;
      srcChars = srcChars + -1;
      cVar7 = cVar7 + '\x01';
    } while (cVar1 != cVar7);
  }
  icu_63::UnicodeString::doAppend
            (output,srcChars,0,0xd - (int)((ulong)((long)srcChars - (long)local_58) >> 1));
  return;
}

Assistant:

void DecimalFormat::doFastFormatInt32(int32_t input, bool isNegative, UnicodeString& output) const {
    U_ASSERT(fields->canUseFastFormat);
    if (isNegative) {
        output.append(fields->fastData.cpMinusSign);
        U_ASSERT(input != INT32_MIN);  // handled by callers
        input = -input;
    }
    // Cap at int32_t to make the buffer small and operations fast.
    // Longest string: "2,147,483,648" (13 chars in length)
    static constexpr int32_t localCapacity = 13;
    char16_t localBuffer[localCapacity];
    char16_t* ptr = localBuffer + localCapacity;
    int8_t group = 0;
    for (int8_t i = 0; i < fields->fastData.maxInt && (input != 0 || i < fields->fastData.minInt); i++) {
        if (group++ == 3 && fields->fastData.cpGroupingSeparator != 0) {
            *(--ptr) = fields->fastData.cpGroupingSeparator;
            group = 1;
        }
        std::div_t res = std::div(input, 10);
        *(--ptr) = static_cast<char16_t>(fields->fastData.cpZero + res.rem);
        input = res.quot;
    }
    int32_t len = localCapacity - static_cast<int32_t>(ptr - localBuffer);
    output.append(ptr, len);
}